

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_from_parent_path_str_n
              (ext_key *hdkey,char *str,size_t str_len,uint32_t child_num,uint32_t flags,
              ext_key *key_out)

{
  int local_44c;
  size_t sStack_448;
  int ret;
  size_t written;
  uint32_t *path_p;
  uint32_t path [255];
  ext_key *key_out_local;
  uint32_t flags_local;
  uint32_t child_num_local;
  size_t str_len_local;
  char *str_local;
  ext_key *hdkey_local;
  
  written = (size_t)&path_p;
  local_44c = path_from_string_n(str,str_len,child_num,flags,(uint32_t *)written,0xff,
                                 &stack0xfffffffffffffbb8);
  if (local_44c == 0) {
    local_44c = bip32_key_from_parent_path(hdkey,(uint32_t *)&path_p,sStack_448,flags,key_out);
  }
  return local_44c;
}

Assistant:

int bip32_key_from_parent_path_str_n(const struct ext_key *hdkey,
                                     const char *str, size_t str_len,
                                     uint32_t child_num, uint32_t flags,
                                     struct ext_key *key_out)
{
    uint32_t path[BIP32_PATH_MAX_LEN], *path_p = path;
    size_t written;
    int ret = path_from_string_n(str, str_len, child_num, flags,
                                 path_p, BIP32_PATH_MAX_LEN, &written);

    if (ret == WALLY_OK)
        ret = bip32_key_from_parent_path(hdkey, path, written, flags, key_out);

    return ret;
}